

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

int mcpl2ssw(char *inmcplfile,char *outsswfile,char *refsswfile,long surface_id,
            long nparticles_limit)

{
  ssw_file_t ff;
  int iVar1;
  char *buf;
  undefined8 uVar2;
  long lVar3;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  int32_t new_np1;
  int32_t new_nrss;
  longlong remaining;
  int64_t rawtype;
  int32_t isurf;
  mcpl_particle_t *mcpl_p;
  longlong skipped_nosswtype;
  long used;
  double ssb [11];
  mcpl_generic_wfilehandle_t fout;
  int32_t orig_np1;
  uint64_t actual_size;
  char *hdrbuf;
  char ref_mcnpflavour_str [64];
  int ssw_mcnp_type;
  int64_t ssw_nrsspos;
  int64_t ssw_np1pos;
  int64_t ssw_hdrlen;
  int ssw_ssblen;
  int ssw_reclen;
  ssw_file_t fsswref;
  mcpl_file_t fmcpl;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  ssw_file_t ff_00;
  int32_t nrss;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int np1;
  char *in_stack_fffffffffffffe98;
  mcpl_generic_wfilehandle_t *in_stack_fffffffffffffea0;
  int local_154;
  char *in_stack_fffffffffffffeb8;
  long lVar4;
  long local_140;
  long local_d8 [3];
  int local_bc;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [76];
  int local_5c;
  long local_58;
  long local_50;
  long local_48;
  int local_40;
  int local_3c;
  ssw_file_t local_38;
  undefined8 local_30;
  long local_28;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = mcpl_open_file(in_RDI);
  buf = (char *)mcpl_hdr_srcname(local_30);
  uVar2 = mcpl_hdr_nparticles(local_30);
  printf("Opened MCPL file produced with \"%s\" (contains %llu particles)\n",buf,uVar2);
  if ((local_20 == 0) && (iVar1 = mcpl_hdr_has_userflags(local_30), iVar1 == 0)) {
    ssw_error((char *)0x105972);
  }
  printf("Opening reference SSW file:\n");
  local_38 = ssw_open_file(in_stack_fffffffffffffeb8);
  ssw_layout(local_38,&local_3c,&local_40,&local_48,&local_50,&local_58);
  local_5c = 0;
  iVar1 = ssw_is_mcnp6(local_38);
  if (iVar1 == 0) {
    iVar1 = ssw_is_mcnpx(local_38);
    if (iVar1 == 0) {
      iVar1 = ssw_is_mcnp5(local_38);
      if (iVar1 != 0) {
        local_5c = 3;
      }
    }
    else {
      local_5c = 2;
    }
  }
  else {
    local_5c = 1;
  }
  local_a8[0] = 0;
  ff_00.internal = local_a8;
  ff.internal._4_4_ = in_stack_fffffffffffffe7c;
  ff.internal._0_4_ = in_stack_fffffffffffffe78;
  ssw_mcnpflavour(ff);
  ssw_strcat((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  ssw_close_file(ff_00);
  mcpl_read_file_to_buffer(local_18,local_48,0,&local_b8,&local_b0);
  if ((local_b0 == (void *)0x0) || (local_b8 != local_48)) {
    ssw_error((char *)0x105ac5);
  }
  local_bc = *(int *)((long)local_b0 + local_50);
  *(undefined4 *)((long)local_b0 + local_50) = 0;
  *(undefined4 *)((long)local_b0 + local_58) = 0;
  printf("Creating (or overwriting) output SSW file.\n");
  mcpl_generic_wfopen(local_d8,local_10);
  if (local_d8[0] == 0) {
    ssw_error((char *)0x105b47);
  }
  mcpl_generic_fwrite(local_d8,local_b0,local_48);
  free(local_b0);
  local_b0 = (void *)0x0;
  if ((local_40 != 10) && (local_40 != 0xb)) {
    ssw_error((char *)0x105b9d);
  }
  if ((local_5c == 1) && (local_40 != 0xb)) {
    ssw_error((char *)0x105bbd);
  }
  local_140 = 0;
  lVar4 = 0;
  printf("Initiating particle conversion loop.\n");
  do {
    while( true ) {
      lVar3 = mcpl_read(local_30);
      nrss = (int32_t)((ulong)ff_00.internal >> 0x20);
      if (lVar3 == 0) goto LAB_00105f60;
      local_154 = (int)local_20;
      if (local_154 == 0) {
        local_154 = *(int *)(lVar3 + 100);
      }
      if ((local_154 < 1) || (1000000 < local_154)) {
        if ((local_154 == 0) && (local_20 == 0)) {
          ssw_error((char *)0x105cfa);
        }
        else {
          ssw_error((char *)0x105d08);
        }
      }
      if (local_5c == 1) {
        iVar1 = conv_mcnp6_pdg2ssw(*(int32_t *)(lVar3 + 0x60));
      }
      else if (local_5c == 2) {
        iVar1 = conv_mcnpx_pdg2ssw(*(int32_t *)(lVar3 + 0x60));
      }
      else if (*(int *)(lVar3 + 0x60) == 0x840) {
        iVar1 = 1;
      }
      else {
        iVar1 = 0;
        if (*(int *)(lVar3 + 0x60) == 0x16) {
          iVar1 = 2;
        }
      }
      in_stack_fffffffffffffea0 = (mcpl_generic_wfilehandle_t *)(long)iVar1;
      if (in_stack_fffffffffffffea0 != (mcpl_generic_wfilehandle_t *)0x0) break;
      lVar4 = lVar4 + 1;
      if ((lVar4 < 0x65) &&
         (printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to an %s particle type\n"
                 ,(long)*(int *)(lVar3 + 0x60),local_a8), lVar4 == 100)) {
        printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
    }
    if ((long)in_stack_fffffffffffffea0 < 1) {
      ssw_error((char *)0x105df7);
    }
    ssw_writerecord(in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),buf);
    nrss = (int32_t)((ulong)ff_00.internal >> 0x20);
    local_140 = local_140 + 1;
  } while (local_140 != local_28);
  lVar3 = mcpl_hdr_nparticles(local_30);
  in_stack_fffffffffffffe98 = (char *)((lVar3 - lVar4) - local_140);
  if (in_stack_fffffffffffffe98 != (char *)0x0) {
    printf("Output limit of %li particles reached. Ignoring remaining %lli particles in the MCPL file.\n"
           ,local_28,in_stack_fffffffffffffe98);
  }
LAB_00105f60:
  printf("Ending particle conversion loop.\n");
  if (lVar4 != 0) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes could not be converted to MCNP types.\n"
           ,lVar4);
  }
  iVar1 = (int)local_140;
  np1 = iVar1;
  if (iVar1 == 0) {
    printf(
          "WARNING: Input MCPL file has 0 useful particles but we are setting number of histories in new SSW file to 1 to avoid creating an invalid file.\n"
          );
    iVar1 = 1;
  }
  if (local_bc < 0) {
    iVar1 = -iVar1;
  }
  ssw_update_nparticles
            (in_stack_fffffffffffffea0,(int64_t)in_stack_fffffffffffffe98,np1,(int64_t)buf,nrss);
  mcpl_close_file(local_30);
  mcpl_generic_fwclose(local_d8);
  lVar4 = (long)iVar1;
  if (lVar4 < 1) {
    lVar4 = -lVar4;
  }
  printf("Created %s with %lli particles (nrss) and %lli histories (np1).\n",local_10,(long)np1,
         lVar4);
  return 1;
}

Assistant:

int mcpl2ssw(const char * inmcplfile, const char * outsswfile, const char * refsswfile,
             long surface_id, long nparticles_limit)
{

  mcpl_file_t fmcpl = mcpl_open_file(inmcplfile);

  printf( "Opened MCPL file produced with \"%s\" (contains %llu particles)\n",
          mcpl_hdr_srcname(fmcpl),
          (unsigned long long)mcpl_hdr_nparticles(fmcpl) );

  if (surface_id==0 && !mcpl_hdr_has_userflags(fmcpl))
    ssw_error("MCPL file contains no userflags so parameter specifying "
              "resulting SSW surface ID of particles is mandatory (use -s<ID>).");

  printf("Opening reference SSW file:\n");
  ssw_file_t fsswref = ssw_open_file(refsswfile);

  //Open reference file and figure out variables like header length, position of
  //"nparticles"-like variables, fortran record length and mcnp version.
  int ssw_reclen;
  int ssw_ssblen;
  int64_t ssw_hdrlen;
  int64_t ssw_np1pos;
  int64_t ssw_nrsspos;
  ssw_layout(fsswref, &ssw_reclen, &ssw_ssblen, &ssw_hdrlen, &ssw_np1pos, &ssw_nrsspos);
  assert(ssw_np1pos<ssw_hdrlen);
  assert(ssw_nrsspos<ssw_hdrlen);

#define SSW_MCNP6 1
#define SSW_MCNPX 2
#define SSW_MCNP5 3
  int ssw_mcnp_type = 0;
  if (ssw_is_mcnp6(fsswref)) {
    ssw_mcnp_type = SSW_MCNP6;
  } else if (ssw_is_mcnpx(fsswref)) {
    ssw_mcnp_type = SSW_MCNPX;
  } else if (ssw_is_mcnp5(fsswref)) {
    ssw_mcnp_type = SSW_MCNP5;
  }
  assert(ssw_mcnp_type>0);
  char ref_mcnpflavour_str[64];
  ref_mcnpflavour_str[0] = '\0';
  ssw_strcat( ref_mcnpflavour_str,
              ssw_mcnpflavour(fsswref),
              sizeof(ref_mcnpflavour_str) );
  ssw_close_file(fsswref);

  //Grab the header:
  char * hdrbuf;
  {
    uint64_t actual_size;
    mcpl_read_file_to_buffer( refsswfile,
                              (uint64_t)ssw_hdrlen,
                              0,//not text
                              &actual_size,
                              &hdrbuf );
    if ( !hdrbuf || actual_size != (uint64_t)ssw_hdrlen )
      ssw_error("Problems extracting header from reference file");
  }

  int32_t orig_np1 = * ((int32_t*)(&hdrbuf[ssw_np1pos]));

  //Clear |np1| and nrss in header to to indicate incomplete info (we will
  //update just before closing the file):
  *((int32_t*)(&hdrbuf[ssw_np1pos])) = 0;
  *((int32_t*)(&hdrbuf[ssw_nrsspos])) = 0;

  printf("Creating (or overwriting) output SSW file.\n");

  //Open new ssw file:
  mcpl_generic_wfilehandle_t fout = mcpl_generic_wfopen( outsswfile );
  if (!fout.internal)
    ssw_error("Problems opening new SSW file");

  //Write header:
  mcpl_generic_fwrite( &fout, hdrbuf, ssw_hdrlen);
  free(hdrbuf);
  hdrbuf = NULL;

  double ssb[11];

  if ( ssw_ssblen != 10 && ssw_ssblen != 11)
    ssw_error("Unexpected length of ssb record in reference SSW file");
  if ( (ssw_mcnp_type == SSW_MCNP6) && ssw_ssblen != 11 )
    ssw_error("Unexpected length of ssb record in reference SSW file (expected 11 for MCNP6 files)");

  //ssb[0] should be history number (starting from 1), but in our case we always
  //put nhistories=nparticles, so it is simply incrementing by 1 for each particle.
  ssb[0] = 0.0;


  assert(surface_id>=0&&surface_id<1000000);


  long used = 0;
  long long skipped_nosswtype = 0;

  printf("Initiating particle conversion loop.\n");

  while ( 1 ) {
    const mcpl_particle_t* mcpl_p = mcpl_read(fmcpl);
    if (!mcpl_p)
      break;
    ++ssb[0];
    ssb[2] = mcpl_p->weight;
    ssb[3] = mcpl_p->ekin;//already in MeV
    ssb[4] = mcpl_p->time * 1.0e5;//milliseconds to "shakes"
    ssb[5] = mcpl_p->position[0];//already in cm
    ssb[6] = mcpl_p->position[1];//already in cm
    ssb[7] = mcpl_p->position[2];//already in cm
    ssb[8] = mcpl_p->direction[0];
    ssb[9] = mcpl_p->direction[1];

    int32_t isurf = surface_id;
    if (!isurf)
      isurf = (int32_t)mcpl_p->userflags;

    if (isurf<=0||isurf>1000000) {
      if (isurf==0&&surface_id==0)
        ssw_error("Could not determine surface ID: no global surface id specified and particle had no (or empty) userflags");
      else
        ssw_error("Surface id must be in range 1..999999");
    }

    int64_t rawtype;
    if (ssw_mcnp_type == SSW_MCNP6) {
      rawtype = conv_mcnp6_pdg2ssw(mcpl_p->pdgcode);
    } else if (ssw_mcnp_type == SSW_MCNPX) {
      rawtype = conv_mcnpx_pdg2ssw(mcpl_p->pdgcode);
    } else {
      assert(ssw_mcnp_type == SSW_MCNP5);
      rawtype = (mcpl_p->pdgcode==2112?1:(mcpl_p->pdgcode==22?2:0));
    }

    if (!rawtype) {
      ++skipped_nosswtype;
      if (skipped_nosswtype<=100) {
        printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to an %s particle type\n",
               (long)mcpl_p->pdgcode,ref_mcnpflavour_str);
        if (skipped_nosswtype==100)
          printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
      continue;
    }

    if ( !(rawtype>0 ) )
      ssw_error("Logic error in PDG code conversions.");
    assert(rawtype>0);

    if (ssw_mcnp_type == SSW_MCNP6) {
      assert(ssw_ssblen==11);
      ssb[10] = isurf;//Should we set the sign of ssb[10] to mean something (we take abs(ssb[10]) in sswread.c)?
      ssb[1] = (double)(((int64_t)rawtype)*4);//Shift 2 bits (thus we only create files with those two bits zero!)
    } else if (ssw_mcnp_type == SSW_MCNPX) {
      ssb[1] = (double)(isurf + 1000000*((int64_t)rawtype));
      if (ssw_ssblen==11)
        ssb[10] = 1.0;//Cosine of angle at surface? Can't calculate it, so we simply set
                      //it to 1 (seems to be not used anyway?)
    } else {
      assert(ssw_mcnp_type == SSW_MCNP5);
      //NOTE: We had for MCPL <=1.6.x: ssb[1] = (isurf + 1000000*rawtype)*8; But
      //now we try instead:
      ssb[1] = (double)((isurf + 100000000*((int64_t)rawtype))*8);
      if (ssw_ssblen==11)
        ssb[10] = 1.0;//Cosine of angle at surface? Can't calculate it, so we simply set
                      //it to 1 (seems to be not used anyway?)
    }

    //Sign of ssb[1] is used to store the sign of dirz:
    assert(ssb[1] >= 1.0);
    if (mcpl_p->direction[2]<0.0)
      ssb[1] = - ssb[1];

    ssw_writerecord(&fout,ssw_reclen,sizeof(double)*ssw_ssblen,(char*)&ssb[0]);
    if (++used==nparticles_limit) {
      long long remaining = mcpl_hdr_nparticles(fmcpl) - skipped_nosswtype - used;
      if (remaining)
        printf("Output limit of %li particles reached. Ignoring remaining %lli particles in the MCPL file.\n",
               nparticles_limit,remaining);
      break;
    }
  }

  printf("Ending particle conversion loop.\n");

  if (skipped_nosswtype) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes"
           " could not be converted to MCNP types.\n",(long long)skipped_nosswtype);
  }

  int32_t new_nrss = used;
  int32_t new_np1 = new_nrss;

  if (new_np1==0) {
    //SSW files must at least have 1 history (but can have 0 particles)
    printf("WARNING: Input MCPL file has 0 useful particles but we are setting number"
           " of histories in new SSW file to 1 to avoid creating an invalid file.\n");
    new_np1 = 1;
  }
  if (orig_np1<0)
    new_np1 = - new_np1;

  ssw_update_nparticles(&fout,ssw_np1pos,new_np1,ssw_nrsspos,new_nrss);

  mcpl_close_file(fmcpl);
  mcpl_generic_fwclose(&fout);

  printf("Created %s with %lli particles (nrss) and %lli histories (np1).\n",outsswfile,(long long)new_nrss,(long long)labs(new_np1));
  return 1;


}